

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPFakeTransmitter::GetLocalHostName
          (RTPFakeTransmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  _List_node_base *this_00;
  uint uVar1;
  _List_node_base *p_Var2;
  RTPMemoryManager *pRVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  hostent *phVar7;
  _Node *p_Var8;
  long lVar9;
  uint8_t *puVar10;
  size_t sVar11;
  undefined1 *puVar12;
  ulong uVar13;
  const_iterator it;
  _List_node_base *p_Var14;
  _Self __tmp;
  uint8_t addr [4];
  string hname;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hostnames;
  allocator<char> local_7d;
  uint local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  uint8_t *local_58;
  ulong *local_50;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (this->init != true) {
    return -0x84;
  }
  if (this->created != true) {
    return -0x83;
  }
  if (this->localhostname == (uint8_t *)0x0) {
    p_Var14 = (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              ._M_node.super__List_node_base._M_next;
    if (p_Var14 == (_List_node_base *)&this->localIPs) {
      return -0x7f;
    }
    this_00 = (_List_node_base *)&local_48;
    local_48._M_impl._M_node._M_size = 0;
    local_58 = buffer;
    local_50 = bufferlength;
    local_48._M_impl._M_node.super__List_node_base._M_next = this_00;
    local_48._M_impl._M_node.super__List_node_base._M_prev = this_00;
    do {
      uVar1 = *(uint *)&p_Var14[1]._M_next;
      local_7c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      phVar7 = gethostbyaddr(&local_7c,4,2);
      if (phVar7 != (hostent *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,phVar7->h_name,&local_7d);
        p_Var8 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 _M_create_node<std::__cxx11::string_const&>
                           ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                            this_00,&local_78);
        std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
        local_48._M_impl._M_node._M_size = local_48._M_impl._M_node._M_size + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var14 = p_Var14->_M_next;
    } while (p_Var14 != (_List_node_base *)&this->localIPs);
    if (local_48._M_impl._M_node.super__List_node_base._M_next == this_00) {
      bVar5 = false;
    }
    else {
      bVar4 = false;
      bVar5 = false;
      p_Var14 = local_48._M_impl._M_node.super__List_node_base._M_next;
      do {
        lVar9 = std::__cxx11::string::find((char)(p_Var14 + 1),0x2e);
        if (lVar9 != -1) {
          p_Var2 = p_Var14[1]._M_prev;
          this->localhostnamelength = (size_t)p_Var2;
          puVar12 = (undefined1 *)((long)&p_Var2->_M_next + 1);
          pRVar3 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
          if (pRVar3 == (RTPMemoryManager *)0x0) {
            puVar10 = (uint8_t *)operator_new__((ulong)puVar12);
          }
          else {
            puVar10 = (uint8_t *)(**(code **)(*(long *)pRVar3 + 0x10))(pRVar3,puVar12,0);
          }
          this->localhostname = puVar10;
          if (puVar10 == (uint8_t *)0x0) {
            bVar5 = true;
            break;
          }
          memcpy(puVar10,p_Var14[1]._M_next,this->localhostnamelength);
          this->localhostname[this->localhostnamelength] = '\0';
          bVar5 = true;
        }
        p_Var14 = p_Var14->_M_next;
        bVar4 = (bool)(p_Var14 == this_00 | bVar5);
      } while (!(bool)(p_Var14 == this_00 | bVar5));
      if (!bVar4) goto LAB_00134766;
    }
    bufferlength = local_50;
    if (!bVar5) {
      uVar1 = *(uint *)&(this->localIPs).
                        super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        _M_node.super__List_node_base._M_next[1]._M_next;
      snprintf((char *)&local_78,0x10,"%d.%d.%d.%d",(ulong)(uVar1 >> 0x18),
               (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 8 & 0xff),uVar1 & 0xff);
      sVar11 = strlen((char *)&local_78);
      this->localhostnamelength = (long)(int)sVar11;
      uVar13 = (long)(int)sVar11 + 1;
      pRVar3 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      if (pRVar3 == (RTPMemoryManager *)0x0) {
        puVar10 = (uint8_t *)operator_new__(uVar13);
      }
      else {
        puVar10 = (uint8_t *)(**(code **)(*(long *)pRVar3 + 0x10))(pRVar3,uVar13,0);
      }
      this->localhostname = puVar10;
      if (puVar10 == (uint8_t *)0x0) {
LAB_00134766:
        std::__cxx11::
        _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_clear(&local_48);
        return -1;
      }
      memcpy(puVar10,&local_78,this->localhostnamelength);
      this->localhostname[this->localhostnamelength] = '\0';
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_48);
    buffer = local_58;
  }
  uVar13 = this->localhostnamelength;
  if (*bufferlength < uVar13) {
    *bufferlength = uVar13;
    iVar6 = -0x45;
  }
  else {
    memcpy(buffer,this->localhostname,uVar13);
    *bufferlength = this->localhostnamelength;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int RTPFakeTransmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!init)
		return ERR_RTP_FAKETRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_NOTCREATED;
	}

	if (localhostname == 0)
	{
		if (localIPs.empty())
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_FAKETRANS_NOLOCALIPS;
		}
		
		std::list<uint32_t>::const_iterator it;
		std::list<std::string> hostnames;
	
		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			struct hostent *he;
			uint8_t addr[4];
			uint32_t ip = (*it);
	
			addr[0] = (uint8_t)((ip>>24)&0xFF);
			addr[1] = (uint8_t)((ip>>16)&0xFF);
			addr[2] = (uint8_t)((ip>>8)&0xFF);
			addr[3] = (uint8_t)(ip&0xFF);
			he = gethostbyaddr((char *)addr,4,AF_INET);
			if (he != 0)
			{
				std::string hname = std::string(he->h_name);
				hostnames.push_back(hname);
			}
		}
	
		bool found  = false;
		
		if (!hostnames.empty())	// try to select the most appropriate hostname
		{
			std::list<std::string>::const_iterator it;
			
			for (it = hostnames.begin() ; !found && it != hostnames.end() ; it++)
			{
				if ((*it).find('.') != std::string::npos)
				{
					found = true;
					localhostnamelength = (*it).length();
					localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];
					if (localhostname == 0)
					{
						MAINMUTEX_UNLOCK
						return ERR_RTP_OUTOFMEM;
					}
					memcpy(localhostname,(*it).c_str(),localhostnamelength);
					localhostname[localhostnamelength] = 0;
				}
			}
		}
	
		if (!found) // use an IP address
		{
			uint32_t ip;
			int len;
			char str[16];
			
			it = localIPs.begin();
			ip = (*it);
			
			snprintf(str,16,"%d.%d.%d.%d",(int)((ip>>24)&0xFF),(int)((ip>>16)&0xFF),(int)((ip>>8)&0xFF),(int)(ip&0xFF));
			len = strlen(str);
	
			localhostnamelength = len;
			localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength + 1];
			if (localhostname == 0)
			{
				MAINMUTEX_UNLOCK
				return ERR_RTP_OUTOFMEM;
			}
			memcpy(localhostname,str,localhostnamelength);
			localhostname[localhostnamelength] = 0;
		}
	}
	
	if ((*bufferlength) < localhostnamelength)
	{
		*bufferlength = localhostnamelength; // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,localhostname,localhostnamelength);
	*bufferlength = localhostnamelength;
	
	MAINMUTEX_UNLOCK
	return 0;
}